

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_req_make2(httpreq **preq,char *method,size_t m_len,CURLU *url,
                            char *scheme_default)

{
  char **part;
  curl_strdup_callback p_Var1;
  CURLUcode CVar2;
  CURLcode CVar3;
  httpreq *req;
  char *pcVar4;
  CURLcode CVar5;
  char *pass;
  char *user;
  char *port;
  char *host;
  dynbuf local_50;
  
  if (m_len - 0x18 < 0xffffffffffffffe7) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  req = (httpreq *)(*Curl_ccalloc)(1,0xa0);
  if (req == (httpreq *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    memcpy(req,method,m_len);
    part = &req->scheme;
    CVar2 = curl_url_get(url,CURLUPART_SCHEME,part,0);
    CVar3 = CURLE_OUT_OF_MEMORY;
    if ((CVar2 == CURLUE_NO_SCHEME) || (CVar2 == CURLUE_OK)) {
      if ((scheme_default != (char *)0x0) && (*part == (char *)0x0)) {
        pcVar4 = (*Curl_cstrdup)(scheme_default);
        *part = pcVar4;
        if (pcVar4 == (char *)0x0) goto LAB_0051c2a8;
      }
      port = (char *)0x0;
      host = (char *)0x0;
      pass = (char *)0x0;
      user = (char *)0x0;
      Curl_dyn_init(&local_50,0x100000);
      CVar2 = curl_url_get(url,CURLUPART_HOST,&host,0);
      CVar3 = CURLE_URL_MALFORMAT;
      if ((CVar2 == CURLUE_NO_HOST) || (CVar2 == CURLUE_OK)) {
        pcVar4 = (char *)0x0;
        if (host == (char *)0x0) {
LAB_0051c193:
          req->authority = pcVar4;
          CVar3 = CURLE_OK;
        }
        else {
          CVar2 = curl_url_get(url,CURLUPART_PORT,&port,2);
          if (((CVar2 == CURLUE_NO_PORT) || (CVar2 == CURLUE_OK)) &&
             ((CVar2 = curl_url_get(url,CURLUPART_USER,&user,0), CVar2 == CURLUE_NO_USER ||
              (CVar2 == CURLUE_OK)))) {
            if (user != (char *)0x0) {
              CVar3 = CURLE_URL_MALFORMAT;
              CVar2 = curl_url_get(url,CURLUPART_PASSWORD,&pass,0);
              if (((CVar2 != CURLUE_NO_PASSWORD) && (CVar2 != CURLUE_OK)) ||
                 ((user != (char *)0x0 &&
                  ((CVar3 = Curl_dyn_add(&local_50,user), CVar3 != CURLE_OK ||
                   (((pass != (char *)0x0 &&
                     (CVar3 = Curl_dyn_addf(&local_50,":%s"), CVar3 != CURLE_OK)) ||
                    (CVar3 = Curl_dyn_add(&local_50,"@"), CVar3 != CURLE_OK))))))))
              goto LAB_0051c19a;
            }
            CVar3 = Curl_dyn_add(&local_50,host);
            if ((CVar3 == CURLE_OK) &&
               ((port == (char *)0x0 || (CVar3 = Curl_dyn_addf(&local_50,":%s"), CVar3 == CURLE_OK))
               )) {
              p_Var1 = Curl_cstrdup;
              pcVar4 = Curl_dyn_ptr(&local_50);
              pcVar4 = (*p_Var1)(pcVar4);
              goto LAB_0051c193;
            }
          }
        }
      }
LAB_0051c19a:
      (*Curl_cfree)(user);
      (*Curl_cfree)(pass);
      (*Curl_cfree)(host);
      (*Curl_cfree)(port);
      Curl_dyn_free(&local_50);
      if (CVar3 == CURLE_OK) {
        pass = (char *)0x0;
        user = (char *)0x0;
        Curl_dyn_init(&local_50,0x100000);
        CVar2 = curl_url_get(url,CURLUPART_PATH,&user,0x10);
        CVar3 = CURLE_URL_MALFORMAT;
        if ((CVar2 == CURLUE_OK) &&
           (CVar2 = curl_url_get(url,CURLUPART_QUERY,&pass,0),
           (CVar2 & ~CURLUE_NO_QUERY) == CURLUE_OK)) {
          if (user == (char *)0x0 && pass == (char *)0x0) {
            req->path = (char *)0x0;
          }
          else if (user == (char *)0x0 || pass != (char *)0x0) {
            if (user == (char *)0x0) {
              CVar5 = CURLE_URL_MALFORMAT;
            }
            else {
              CVar3 = Curl_dyn_add(&local_50,user);
              if (CVar3 != CURLE_OK) goto LAB_0051c287;
              CVar5 = CURLE_OK;
            }
            if (pass != (char *)0x0) {
              CVar3 = Curl_dyn_addf(&local_50,"?%s");
              CVar5 = CURLE_OK;
              if (CVar3 != CURLE_OK) goto LAB_0051c287;
            }
            CVar3 = CVar5;
            p_Var1 = Curl_cstrdup;
            pcVar4 = Curl_dyn_ptr(&local_50);
            pcVar4 = (*p_Var1)(pcVar4);
            req->path = pcVar4;
            if (pcVar4 == (char *)0x0) goto LAB_0051c287;
          }
          else {
            req->path = user;
            user = (char *)0x0;
          }
          CVar3 = CURLE_OK;
        }
LAB_0051c287:
        (*Curl_cfree)(user);
        (*Curl_cfree)(pass);
        Curl_dyn_free(&local_50);
        if (CVar3 == CURLE_OK) {
          CVar3 = CURLE_OK;
          Curl_dynhds_init(&req->headers,0,0x100000);
          Curl_dynhds_init(&req->trailers,0,0x100000);
          goto LAB_0051c2b3;
        }
      }
    }
LAB_0051c2a8:
    Curl_http_req_free(req);
  }
  req = (httpreq *)0x0;
LAB_0051c2b3:
  *preq = req;
  return CVar3;
}

Assistant:

CURLcode Curl_http_req_make2(struct httpreq **preq,
                             const char *method, size_t m_len,
                             CURLU *url, const char *scheme_default)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  CURLUcode uc;

  DEBUGASSERT(method);
  if(m_len + 1 > sizeof(req->method))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  req = calloc(1, sizeof(*req));
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);

  uc = curl_url_get(url, CURLUPART_SCHEME, &req->scheme, 0);
  if(uc && uc != CURLUE_NO_SCHEME)
    goto out;
  if(!req->scheme && scheme_default) {
    req->scheme = strdup(scheme_default);
    if(!req->scheme)
      goto out;
  }

  result = req_assign_url_authority(req, url);
  if(result)
    goto out;
  result = req_assign_url_path(req, url);
  if(result)
    goto out;

  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result? NULL : req;
  return result;
}